

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_tool.c
# Opt level: O0

void print_info(output_data_switch query,cpu_id_t *data)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  msr_driver_t *handle;
  int value;
  int i;
  cpu_id_t *data_local;
  output_data_switch query_local;
  
  if ((data == (cpu_id_t *)0x0) && (iVar2 = check_need_raw_data(), iVar2 != 0)) {
    fprintf(_stderr,"print_info: raw data is required but not provided.\n");
  }
  else {
    pFVar1 = fout;
    switch(query) {
    case NEED_CPUID_PRESENT:
      uVar3 = cpuid_present();
      fprintf((FILE *)pFVar1,"%d\n",(ulong)uVar3);
      break;
    case NEED_ARCHITECTURE:
      uVar5 = cpu_architecture_str(data->architecture);
      fprintf((FILE *)pFVar1,"%s\n",uVar5);
      break;
    case NEED_FEATURE_LEVEL:
      uVar5 = cpu_feature_level_str(data->feature_level);
      fprintf((FILE *)pFVar1,"%s\n",uVar5);
      break;
    case NEED_PURPOSE:
      uVar5 = cpu_purpose_str(data->purpose);
      fprintf((FILE *)pFVar1,"%s\n",uVar5);
      break;
    case NEED_VENDOR_STR:
      fprintf((FILE *)fout,"%s\n",data->vendor_str);
      break;
    case NEED_VENDOR_ID:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->vendor);
      break;
    case NEED_BRAND_STRING:
      fprintf((FILE *)fout,"%s\n",data->brand_str);
      break;
    case NEED_FAMILY:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)(data->field_11).x86.family);
      break;
    case NEED_MODEL:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)(data->field_11).x86.model);
      break;
    case NEED_STEPPING:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)(data->field_11).x86.stepping);
      break;
    case NEED_EXT_FAMILY:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)(data->field_11).x86.ext_family);
      break;
    case NEED_EXT_MODEL:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)(data->field_11).x86.ext_model);
      break;
    case NEED_IMPLEMENTER:
      fprintf((FILE *)fout,"%d\n",(ulong)(data->field_11).arm.implementer);
      break;
    case NEED_VARIANT:
      fprintf((FILE *)fout,"%d\n",(ulong)(data->field_11).arm.variant);
      break;
    case NEED_PART_NUM:
      fprintf((FILE *)fout,"%d\n",(ulong)(data->field_11).arm.part_num);
      break;
    case NEED_REVISION:
      fprintf((FILE *)fout,"%d\n",(ulong)(data->field_11).arm.revision);
      break;
    case NEED_NUM_CORES:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->num_cores);
      break;
    case NEED_NUM_LOGICAL:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->num_logical_cpus);
      break;
    case NEED_TOTAL_CPUS:
      uVar3 = cpuid_get_total_cpus();
      fprintf((FILE *)pFVar1,"%d\n",(ulong)uVar3);
      break;
    case NEED_AFFI_MASK:
      uVar5 = affinity_mask_str(&data->affinity_mask);
      fprintf((FILE *)pFVar1,"0x%s\n",uVar5);
      break;
    case NEED_L1D_SIZE:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l1_data_cache);
      break;
    case NEED_L1I_SIZE:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l1_instruction_cache);
      break;
    case NEED_L2_SIZE:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l2_cache);
      break;
    case NEED_L3_SIZE:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l3_cache);
      break;
    case NEED_L4_SIZE:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l4_cache);
      break;
    case NEED_L1D_ASSOC:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l1_data_assoc);
      break;
    case NEED_L1I_ASSOC:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l1_instruction_assoc);
      break;
    case NEED_L2_ASSOC:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l2_assoc);
      break;
    case NEED_L3_ASSOC:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l3_assoc);
      break;
    case NEED_L4_ASSOC:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l4_assoc);
      break;
    case NEED_L1D_CACHELINE:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l1_data_cacheline);
      break;
    case NEED_L1I_CACHELINE:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l1_instruction_cacheline);
      break;
    case NEED_L2_CACHELINE:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l2_cacheline);
      break;
    case NEED_L3_CACHELINE:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l3_cacheline);
      break;
    case NEED_L4_CACHELINE:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l4_cacheline);
      break;
    case NEED_L1D_INSTANCES:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l1_data_instances);
      break;
    case NEED_L1I_INSTANCES:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l1_instruction_instances);
      break;
    case NEED_L2_INSTANCES:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l2_instances);
      break;
    case NEED_L3_INSTANCES:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l3_instances);
      break;
    case NEED_L4_INSTANCES:
      fprintf((FILE *)fout,"%d\n",(ulong)(uint)data->l4_instances);
      break;
    case NEED_CODENAME:
      fprintf((FILE *)fout,"%s\n",data->cpu_codename);
      break;
    case NEED_FEATURES:
      for (handle._4_4_ = 0; pFVar1 = fout, handle._4_4_ < 0x150; handle._4_4_ = handle._4_4_ + 1) {
        if (data->flags[handle._4_4_] != '\0') {
          uVar5 = cpu_feature_str(handle._4_4_);
          fprintf((FILE *)pFVar1," %s",uVar5);
        }
      }
      fprintf((FILE *)fout,"\n");
      break;
    case NEED_CLOCK:
      uVar3 = cpu_clock();
      fprintf((FILE *)pFVar1,"%d\n",(ulong)uVar3);
      break;
    case NEED_CLOCK_OS:
      uVar3 = cpu_clock_by_os();
      fprintf((FILE *)pFVar1,"%d\n",(ulong)uVar3);
      break;
    case NEED_CLOCK_RDTSC:
      uVar3 = cpu_clock_measure(400,1);
      fprintf((FILE *)pFVar1,"%d\n",(ulong)uVar3);
      break;
    case NEED_CLOCK_IC:
      uVar3 = cpu_clock_by_ic(0x19,0x10);
      fprintf((FILE *)pFVar1,"%d\n",(ulong)uVar3);
      break;
    case NEED_RDMSR:
      lVar4 = cpu_msr_driver_open();
      pFVar1 = fout;
      if (lVar4 == 0) {
        uVar5 = cpuid_error();
        fprintf((FILE *)pFVar1,"Cannot open MSR driver: %s\n",uVar5);
      }
      else {
        uVar3 = cpu_msrinfo(lVar4,0);
        if (uVar3 != 0x3fffffff) {
          fprintf((FILE *)fout,"  MSR.mperf  : %d MHz\n",(ulong)uVar3);
        }
        uVar3 = cpu_msrinfo(lVar4,1);
        if (uVar3 != 0x3fffffff) {
          fprintf((FILE *)fout,"  MSR.aperf  : %d MHz\n",(ulong)uVar3);
        }
        iVar2 = cpu_msrinfo(lVar4,2);
        if (iVar2 != 0x3fffffff) {
          fprintf((FILE *)fout,"  min. multi.: %.2lf\n",(double)iVar2 / 100.0);
        }
        iVar2 = cpu_msrinfo(lVar4,3);
        if (iVar2 != 0x3fffffff) {
          fprintf((FILE *)fout,"  cur. multi.: %.2lf\n",(double)iVar2 / 100.0);
        }
        iVar2 = cpu_msrinfo(lVar4,4);
        if (iVar2 != 0x3fffffff) {
          fprintf((FILE *)fout,"  max. multi.: %.2lf\n",(double)iVar2 / 100.0);
        }
        uVar3 = cpu_msrinfo(lVar4,5);
        if (uVar3 != 0x3fffffff) {
          fprintf((FILE *)fout,"  temperature: %d degrees Celsius\n",(ulong)uVar3);
        }
        iVar2 = cpu_msrinfo(lVar4,6);
        if (iVar2 != 0x3fffffff) {
          pcVar6 = "no";
          if (iVar2 != 0) {
            pcVar6 = "yes";
          }
          fprintf((FILE *)fout,"  throttling : %s\n",pcVar6);
        }
        iVar2 = cpu_msrinfo(lVar4,7);
        if (iVar2 != 0x3fffffff) {
          fprintf((FILE *)fout,"  core volt. : %.2lf Volts\n",(double)iVar2 / 100.0);
        }
        iVar2 = cpu_msrinfo(lVar4,9);
        if (iVar2 != 0x3fffffff) {
          fprintf((FILE *)fout,"  bus clock  : %.2lf MHz\n",(double)iVar2 / 100.0);
        }
        cpu_msr_driver_close(lVar4);
      }
      break;
    case NEED_RDMSR_RAW:
      lVar4 = cpu_msr_driver_open();
      pFVar1 = fout;
      if (lVar4 == 0) {
        uVar5 = cpuid_error();
        fprintf((FILE *)pFVar1,"Cannot open MSR driver: %s\n",uVar5);
      }
      else {
        msr_serialize_raw_data(lVar4,"");
        cpu_msr_driver_close(lVar4);
      }
      break;
    case NEED_SSE_UNIT_SIZE:
      pcVar6 = "non-authoritative";
      if (data->detection_hints[0] != '\0') {
        pcVar6 = "authoritative";
      }
      fprintf((FILE *)fout,"%d (%s)\n",(ulong)(uint)(data->field_11).x86.sse_size,pcVar6);
      break;
    default:
      fprintf((FILE *)fout,"How did you get here?!?\n");
    }
  }
  return;
}

Assistant:

static void print_info(output_data_switch query, struct cpu_id_t* data)
{
	int i, value;
	struct msr_driver_t* handle;

	/* Check if function is properly called */
	if ((data == NULL) && check_need_raw_data()) {
		fprintf(stderr, "print_info: raw data is required but not provided.\n");
		return;
	}

	switch (query) {
		case NEED_CPUID_PRESENT:
			fprintf(fout, "%d\n", cpuid_present());
			break;
		case NEED_ARCHITECTURE:
			fprintf(fout, "%s\n", cpu_architecture_str(data->architecture));
			break;
		case NEED_FEATURE_LEVEL:
			fprintf(fout, "%s\n", cpu_feature_level_str(data->feature_level));
			break;
		case NEED_PURPOSE:
			fprintf(fout, "%s\n", cpu_purpose_str(data->purpose));
			break;
		case NEED_VENDOR_STR:
			fprintf(fout, "%s\n", data->vendor_str);
			break;
		case NEED_VENDOR_ID:
			fprintf(fout, "%d\n", data->vendor);
			break;
		case NEED_BRAND_STRING:
			fprintf(fout, "%s\n", data->brand_str);
			break;
		case NEED_FAMILY:
			fprintf(fout, "%d\n", data->x86.family);
			break;
		case NEED_MODEL:
			fprintf(fout, "%d\n", data->x86.model);
			break;
		case NEED_STEPPING:
			fprintf(fout, "%d\n", data->x86.stepping);
			break;
		case NEED_EXT_FAMILY:
			fprintf(fout, "%d\n", data->x86.ext_family);
			break;
		case NEED_EXT_MODEL:
			fprintf(fout, "%d\n", data->x86.ext_model);
			break;
		case NEED_IMPLEMENTER:
			fprintf(fout, "%d\n", data->arm.implementer);
			break;
		case NEED_VARIANT:
			fprintf(fout, "%d\n", data->arm.variant);
			break;
		case NEED_PART_NUM:
			fprintf(fout, "%d\n", data->arm.part_num);
			break;
		case NEED_REVISION:
			fprintf(fout, "%d\n", data->arm.revision);
			break;
		case NEED_NUM_CORES:
			fprintf(fout, "%d\n", data->num_cores);
			break;
		case NEED_NUM_LOGICAL:
			fprintf(fout, "%d\n", data->num_logical_cpus);
			break;
		case NEED_TOTAL_CPUS:
			fprintf(fout, "%d\n", cpuid_get_total_cpus());
			break;
		case NEED_AFFI_MASK:
			fprintf(fout, "0x%s\n", affinity_mask_str(&data->affinity_mask));
			break;
		case NEED_L1D_SIZE:
			fprintf(fout, "%d\n", data->l1_data_cache);
			break;
		case NEED_L1I_SIZE:
			fprintf(fout, "%d\n", data->l1_instruction_cache);
			break;
		case NEED_L2_SIZE:
			fprintf(fout, "%d\n", data->l2_cache);
			break;
		case NEED_L3_SIZE:
			fprintf(fout, "%d\n", data->l3_cache);
			break;
		case NEED_L4_SIZE:
			fprintf(fout, "%d\n", data->l4_cache);
			break;
		case NEED_L1D_ASSOC:
			fprintf(fout, "%d\n", data->l1_data_assoc);
			break;
		case NEED_L1I_ASSOC:
			fprintf(fout, "%d\n", data->l1_instruction_assoc);
			break;
		case NEED_L2_ASSOC:
			fprintf(fout, "%d\n", data->l2_assoc);
			break;
		case NEED_L3_ASSOC:
			fprintf(fout, "%d\n", data->l3_assoc);
			break;
		case NEED_L4_ASSOC:
			fprintf(fout, "%d\n", data->l4_assoc);
			break;
		case NEED_L1D_CACHELINE:
			fprintf(fout, "%d\n", data->l1_data_cacheline);
			break;
		case NEED_L1I_CACHELINE:
			fprintf(fout, "%d\n", data->l1_instruction_cacheline);
			break;
		case NEED_L2_CACHELINE:
			fprintf(fout, "%d\n", data->l2_cacheline);
			break;
		case NEED_L3_CACHELINE:
			fprintf(fout, "%d\n", data->l3_cacheline);
			break;
		case NEED_L4_CACHELINE:
			fprintf(fout, "%d\n", data->l4_cacheline);
			break;
		case NEED_L1D_INSTANCES:
			fprintf(fout, "%d\n", data->l1_data_instances);
			break;
		case NEED_L1I_INSTANCES:
			fprintf(fout, "%d\n", data->l1_instruction_instances);
			break;
		case NEED_L2_INSTANCES:
			fprintf(fout, "%d\n", data->l2_instances);
			break;
		case NEED_L3_INSTANCES:
			fprintf(fout, "%d\n", data->l3_instances);
			break;
		case NEED_L4_INSTANCES:
			fprintf(fout, "%d\n", data->l4_instances);
			break;
		case NEED_CODENAME:
			fprintf(fout, "%s\n", data->cpu_codename);
			break;
		case NEED_FEATURES:
		{
			for (i = 0; i < NUM_CPU_FEATURES; i++)
				if (data->flags[i])
					fprintf(fout, " %s", cpu_feature_str(i));
			fprintf(fout, "\n");
			break;
		}
		case NEED_CLOCK:
			fprintf(fout, "%d\n", cpu_clock());
			break;
		case NEED_CLOCK_OS:
			fprintf(fout, "%d\n", cpu_clock_by_os());
			break;
		case NEED_CLOCK_RDTSC:
			fprintf(fout, "%d\n", cpu_clock_measure(400, 1));
			break;
		case NEED_CLOCK_IC:
			fprintf(fout, "%d\n", cpu_clock_by_ic(25, 16));
			break;
		case NEED_RDMSR:
		{
			if ((handle = cpu_msr_driver_open()) == NULL) {
				fprintf(fout, "Cannot open MSR driver: %s\n", cpuid_error());
			} else {
				if ((value = cpu_msrinfo(handle, INFO_MPERF)) != CPU_INVALID_VALUE)
					fprintf(fout, "  MSR.mperf  : %d MHz\n", value);
				if ((value = cpu_msrinfo(handle, INFO_APERF)) != CPU_INVALID_VALUE)
					fprintf(fout, "  MSR.aperf  : %d MHz\n", value);
				if ((value = cpu_msrinfo(handle, INFO_MIN_MULTIPLIER)) != CPU_INVALID_VALUE)
					fprintf(fout, "  min. multi.: %.2lf\n", value / 100.0);
				if ((value = cpu_msrinfo(handle, INFO_CUR_MULTIPLIER)) != CPU_INVALID_VALUE)
					fprintf(fout, "  cur. multi.: %.2lf\n", value / 100.0);
				if ((value = cpu_msrinfo(handle, INFO_MAX_MULTIPLIER)) != CPU_INVALID_VALUE)
					fprintf(fout, "  max. multi.: %.2lf\n", value / 100.0);
				if ((value = cpu_msrinfo(handle, INFO_TEMPERATURE)) != CPU_INVALID_VALUE)
					fprintf(fout, "  temperature: %d degrees Celsius\n", value);
				if ((value = cpu_msrinfo(handle, INFO_THROTTLING)) != CPU_INVALID_VALUE)
					fprintf(fout, "  throttling : %s\n", value ? "yes" : "no");
				if ((value = cpu_msrinfo(handle, INFO_VOLTAGE)) != CPU_INVALID_VALUE)
					fprintf(fout, "  core volt. : %.2lf Volts\n", value / 100.0);
				if ((value = cpu_msrinfo(handle, INFO_BUS_CLOCK)) != CPU_INVALID_VALUE)
					fprintf(fout, "  bus clock  : %.2lf MHz\n", value / 100.0);
				cpu_msr_driver_close(handle);
			}
			break;
		}
		case NEED_RDMSR_RAW:
		{
			if ((handle = cpu_msr_driver_open()) == NULL) {
				fprintf(fout, "Cannot open MSR driver: %s\n", cpuid_error());
			} else {
				msr_serialize_raw_data(handle, "");
				cpu_msr_driver_close(handle);
			}
			break;
		}
		case NEED_SSE_UNIT_SIZE:
		{
			fprintf(fout, "%d (%s)\n", data->x86.sse_size,
				data->detection_hints[CPU_HINT_SSE_SIZE_AUTH] ? "authoritative" : "non-authoritative");
			break;
		}
		default:
			fprintf(fout, "How did you get here?!?\n");
			break;
	}
}